

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  uint uVar9;
  uv_cpu_info_t *puVar10;
  uint count_00;
  ulong __nmemb;
  ulong uVar11;
  ulong uVar12;
  uint64_t user;
  uint local_474;
  uv_cpu_info_t **local_470;
  uint *local_468;
  uint64_t irq;
  uint64_t idle;
  uint64_t sys;
  uint64_t nice;
  uint64_t dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    return -*piVar7;
  }
  local_468 = (uint *)count;
  pcVar4 = fgets(buf,0x400,__stream);
  if (pcVar4 != (char *)0x0) {
    count_00 = 0;
    while ((pcVar4 = fgets(buf,0x400,__stream), pcVar4 != (char *)0x0 &&
           (iVar2 = bcmp(buf,"cpu",3), iVar2 == 0))) {
      count_00 = count_00 + 1;
    }
    if (count_00 != 0) {
      __nmemb = (ulong)count_00;
      cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
      if (cpu_infos_00 == (uv_cpu_info_t *)0x0) {
        iVar2 = -0xc;
      }
      else {
        pFVar5 = (FILE *)uv__open_file("/proc/cpuinfo");
        local_470 = cpu_infos;
        if (pFVar5 != (FILE *)0x0) {
          uVar11 = 0;
          uVar12 = 0;
          do {
            puVar10 = cpu_infos_00 + (uVar11 & 0xffffffff);
            uVar11 = uVar11 & 0xffffffff;
            do {
              while( true ) {
                pcVar4 = fgets(buf,0x400,pFVar5);
                if (pcVar4 == (char *)0x0) {
                  fclose(pFVar5);
                  if (uVar11 == 0) {
                    pcVar4 = "unknown";
                  }
                  else {
                    pcVar4 = cpu_infos_00[(int)uVar11 - 1].model;
                  }
                  goto LAB_0014274f;
                }
                if ((__nmemb <= uVar11) || (iVar2 = bcmp(buf,"model name\t: ",0xd), iVar2 != 0))
                break;
                sVar6 = strlen(buf + 0xd);
                pcVar4 = uv__strndup(buf + 0xd,sVar6 - 1);
                if (pcVar4 == (char *)0x0) {
                  fclose(pFVar5);
                  goto LAB_001429aa;
                }
                cpu_infos_00[uVar11].model = pcVar4;
                puVar10 = puVar10 + 1;
                uVar11 = uVar11 + 1;
              }
            } while ((__nmemb <= uVar12) ||
                    (iVar2 = bcmp(buf,read_models_speed_marker,0xb), iVar2 != 0));
            iVar2 = atoi(buf + 0xb);
            cpu_infos_00[uVar12].speed = iVar2;
            uVar12 = uVar12 + 1;
          } while( true );
        }
        piVar7 = __errno_location();
        if (*piVar7 != 0) {
          iVar2 = -*piVar7;
          goto LAB_001429b3;
        }
LAB_00142783:
        uVar11 = sysconf(2);
        if ((int)uVar11 == 0) {
          __assert_fail("ticks != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/linux-core.c"
                        ,0x21c,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        if ((int)uVar11 == -1) {
          __assert_fail("ticks != (unsigned int) -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/linux-core.c"
                        ,0x21b,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        uVar11 = 1000 / (uVar11 & 0xffffffff);
        rewind(__stream);
        pcVar4 = fgets(buf,0x400,__stream);
        if (pcVar4 == (char *)0x0) goto LAB_001429c3;
        uVar12 = 0;
        while (((pcVar4 = fgets(buf,0x400,__stream), pcVar4 != (char *)0x0 && (uVar12 < __nmemb)) &&
               (iVar2 = bcmp(buf,"cpu",3), iVar2 == 0))) {
          iVar2 = __isoc99_sscanf(buf,"cpu%u ",&local_474);
          if (iVar2 != 1) {
            __assert_fail("r == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/linux-core.c"
                          ,0x231,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
          }
          pcVar4 = buf + 4;
          uVar9 = local_474;
          do {
            pcVar4 = pcVar4 + 1;
            bVar1 = 9 < uVar9;
            uVar9 = uVar9 / 10;
          } while (bVar1);
          iVar2 = __isoc99_sscanf(pcVar4,"%lu %lu %lu%lu %lu %lu",&user,&nice,&sys,&idle,&dummy,&irq
                                 );
          if (iVar2 != 6) goto LAB_001429c3;
          cpu_infos_00[uVar12].cpu_times.user = user * uVar11;
          cpu_infos_00[uVar12].cpu_times.nice = nice * uVar11;
          cpu_infos_00[uVar12].cpu_times.sys = sys * uVar11;
          cpu_infos_00[uVar12].cpu_times.idle = idle * uVar11;
          cpu_infos_00[uVar12].cpu_times.irq = irq * uVar11;
          uVar12 = uVar12 + 1;
        }
        if (uVar12 != __nmemb) {
          __assert_fail("num == numcpus",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/linux-core.c"
                        ,0x24e,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        if (cpu_infos_00->speed == 0) {
          piVar7 = &cpu_infos_00->speed;
          for (uVar11 = 0; __nmemb != uVar11; uVar11 = uVar11 + 1) {
            iVar2 = 0;
            snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                     uVar11 & 0xffffffff);
            pFVar5 = (FILE *)uv__open_file(buf);
            if (pFVar5 != (FILE *)0x0) {
              iVar2 = __isoc99_fscanf(pFVar5,"%lu",&user);
              if (iVar2 != 1) {
                user = 0;
              }
              fclose(pFVar5);
              iVar2 = (int)(user / 1000);
            }
            *piVar7 = iVar2;
            piVar7 = piVar7 + 0xe;
          }
        }
        *local_470 = cpu_infos_00;
        *local_468 = count_00;
        iVar2 = 0;
      }
      goto LAB_001426cd;
    }
  }
  iVar2 = -5;
LAB_001426cd:
  iVar3 = fclose(__stream);
  if (iVar3 != 0) {
    piVar7 = __errno_location();
    if ((*piVar7 != 4) && (*piVar7 != 0x73)) {
LAB_001429c3:
      abort();
    }
  }
  return iVar2;
LAB_0014274f:
  if (__nmemb <= uVar11) goto LAB_00142783;
  sVar6 = strlen(pcVar4);
  pcVar8 = uv__strndup(pcVar4,sVar6);
  if (pcVar8 == (char *)0x0) goto LAB_001429aa;
  uVar11 = uVar11 + 1;
  puVar10->model = pcVar8;
  puVar10 = puVar10 + 1;
  goto LAB_0014274f;
LAB_001429aa:
  iVar2 = -0xc;
LAB_001429b3:
  uv_free_cpu_info(cpu_infos_00,count_00);
  goto LAB_001426cd;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}